

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O0

bool __thiscall CBloomFilter::IsRelevantAndUpdate(CBloomFilter *this,CTransaction *tx)

{
  long lVar1;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  bool bVar2;
  CScript *this_00;
  CScript *pCVar3;
  size_type sVar4;
  COutPoint *in_RDI;
  long in_FS_OFFSET;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  TxoutType type;
  CTxOut *txout;
  uint i;
  Txid *hash;
  bool fFound;
  opcodetype opcode_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  const_iterator pc_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  opcodetype opcode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  const_iterator pc;
  undefined4 in_stack_fffffffffffffe58;
  uint32_t in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe65;
  undefined1 in_stack_fffffffffffffe66;
  undefined1 in_stack_fffffffffffffe67;
  const_iterator in_stack_fffffffffffffe68;
  CBloomFilter *in_stack_fffffffffffffe70;
  TxoutType in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7c;
  undefined1 in_stack_fffffffffffffe7d;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 in_stack_fffffffffffffe7f;
  const_iterator in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  uint local_124;
  bool local_111;
  byte local_f9;
  CBloomFilter local_b0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_ffffffffffffff80;
  CScript *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffe68.ptr);
  if (bVar2) {
    local_f9 = 1;
  }
  else {
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    transaction_identifier<false>::ToUint256
              ((transaction_identifier<false> *)
               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    Span<const_unsigned_char>::Span<uint256>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffe68.ptr,
               (uint256 *)
               CONCAT17(in_stack_fffffffffffffe67,
                        CONCAT16(in_stack_fffffffffffffe66,
                                 CONCAT15(in_stack_fffffffffffffe65,
                                          CONCAT14(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60)))),
               (type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    vKey.m_size._0_4_ = in_stack_fffffffffffffe98;
    vKey.m_data = (uchar *)in_RDI;
    vKey.m_size._4_4_ = in_stack_fffffffffffffe9c;
    local_111 = contains(in_stack_fffffffffffffe70,vKey);
    local_124 = 0;
    while( true ) {
      this_00 = (CScript *)(ulong)local_124;
      pCVar3 = (CScript *)
               std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                         ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                          CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      if (pCVar3 <= this_00) break;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffe68.ptr,
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT15(in_stack_fffffffffffffe65,
                                            CONCAT14(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60)))));
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT15(in_stack_fffffffffffffe65,
                                            CONCAT14(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60)))));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      do {
        do {
          in_stack_fffffffffffffe80 =
               prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(in_stack_fffffffffffffe67,
                                   CONCAT16(in_stack_fffffffffffffe66,
                                            CONCAT15(in_stack_fffffffffffffe65,
                                                     CONCAT14(in_stack_fffffffffffffe64,
                                                              in_stack_fffffffffffffe60)))));
          in_stack_fffffffffffffe7f =
               prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                         ((const_iterator *)
                          CONCAT17(in_stack_fffffffffffffe67,
                                   CONCAT16(in_stack_fffffffffffffe66,
                                            CONCAT15(in_stack_fffffffffffffe65,
                                                     CONCAT14(in_stack_fffffffffffffe64,
                                                              in_stack_fffffffffffffe60)))),
                          in_stack_fffffffffffffe68);
          if ((!(bool)in_stack_fffffffffffffe7f) ||
             (in_stack_fffffffffffffe7e =
                   CScript::GetOp(this_00,(const_iterator *)in_stack_fffffffffffffe80.ptr,
                                  (opcodetype *)
                                  CONCAT17(in_stack_fffffffffffffe7f,
                                           CONCAT16(in_stack_fffffffffffffe7e,
                                                    CONCAT15(in_stack_fffffffffffffe7d,
                                                             CONCAT14(in_stack_fffffffffffffe7c,
                                                                      in_stack_fffffffffffffe78)))),
                                  &in_stack_fffffffffffffe70->vData),
             !(bool)in_stack_fffffffffffffe7e)) goto LAB_019125d8;
          sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        } while (sVar4 == 0);
        Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<const_unsigned_char> *)in_stack_fffffffffffffe68.ptr,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffe67,
                            CONCAT16(in_stack_fffffffffffffe66,
                                     CONCAT15(in_stack_fffffffffffffe65,
                                              CONCAT14(in_stack_fffffffffffffe64,
                                                       in_stack_fffffffffffffe60)))),
                   (type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        vKey_00.m_size._0_4_ = in_stack_fffffffffffffe98;
        vKey_00.m_data = (uchar *)in_RDI;
        vKey_00.m_size._4_4_ = in_stack_fffffffffffffe9c;
        in_stack_fffffffffffffe7d = contains(in_stack_fffffffffffffe70,vKey_00);
      } while (!(bool)in_stack_fffffffffffffe7d);
      local_111 = true;
      if ((in_RDI->n & 3) == 1) {
        COutPoint::COutPoint
                  ((COutPoint *)in_stack_fffffffffffffe68.ptr,
                   (Txid *)CONCAT17(in_stack_fffffffffffffe67,
                                    CONCAT16(in_stack_fffffffffffffe66,
                                             CONCAT15(in_stack_fffffffffffffe65,
                                                      CONCAT14(in_stack_fffffffffffffe64,
                                                               in_stack_fffffffffffffe60)))),
                   in_stack_fffffffffffffe5c);
        insert((CBloomFilter *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),in_RDI)
        ;
      }
      else if ((in_RDI->n & 3) == 2) {
        in_stack_fffffffffffffe70 = &local_b0;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        in_stack_fffffffffffffe78 = Solver(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        if ((in_stack_fffffffffffffe78 == PUBKEY) || (in_stack_fffffffffffffe78 == MULTISIG)) {
          COutPoint::COutPoint
                    ((COutPoint *)in_stack_fffffffffffffe68.ptr,
                     (Txid *)CONCAT17(in_stack_fffffffffffffe67,
                                      CONCAT16(in_stack_fffffffffffffe66,
                                               CONCAT15(in_stack_fffffffffffffe65,
                                                        CONCAT14(in_stack_fffffffffffffe64,
                                                                 in_stack_fffffffffffffe60)))),
                     in_stack_fffffffffffffe5c);
          insert((CBloomFilter *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_RDI);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)in_stack_fffffffffffffe68.ptr);
      }
LAB_019125d8:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffe68.ptr);
      local_124 = local_124 + 1;
    }
    if (local_111 == false) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT15(in_stack_fffffffffffffe65,
                                            CONCAT14(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60)))));
      std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT17(in_stack_fffffffffffffe67,
                          CONCAT16(in_stack_fffffffffffffe66,
                                   CONCAT15(in_stack_fffffffffffffe65,
                                            CONCAT14(in_stack_fffffffffffffe64,
                                                     in_stack_fffffffffffffe60)))));
      while (bVar2 = __gnu_cxx::
                     operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                 *)in_stack_fffffffffffffe68.ptr,
                                (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffe67,
                                            CONCAT16(in_stack_fffffffffffffe66,
                                                     CONCAT15(in_stack_fffffffffffffe65,
                                                              CONCAT14(in_stack_fffffffffffffe64,
                                                                       in_stack_fffffffffffffe60))))
                               ), ((bVar2 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                  CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        bVar2 = contains((CBloomFilter *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),in_RDI);
        if (bVar2) {
          local_f9 = 1;
          goto LAB_0191281b;
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   CONCAT17(in_stack_fffffffffffffe67,
                            CONCAT16(in_stack_fffffffffffffe66,
                                     CONCAT15(in_stack_fffffffffffffe65,
                                              CONCAT14(in_stack_fffffffffffffe64,
                                                       in_stack_fffffffffffffe60)))));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        do {
          do {
            in_stack_fffffffffffffe68 =
                 prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                            CONCAT17(in_stack_fffffffffffffe67,
                                     CONCAT16(in_stack_fffffffffffffe66,
                                              CONCAT15(in_stack_fffffffffffffe65,
                                                       CONCAT14(in_stack_fffffffffffffe64,
                                                                in_stack_fffffffffffffe60)))));
            in_stack_fffffffffffffe67 =
                 prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator<
                           ((const_iterator *)
                            CONCAT17(in_stack_fffffffffffffe67,
                                     CONCAT16(in_stack_fffffffffffffe66,
                                              CONCAT15(in_stack_fffffffffffffe65,
                                                       CONCAT14(in_stack_fffffffffffffe64,
                                                                in_stack_fffffffffffffe60)))),
                            in_stack_fffffffffffffe68);
            if ((!(bool)in_stack_fffffffffffffe67) ||
               (in_stack_fffffffffffffe66 =
                     CScript::GetOp(this_00,(const_iterator *)in_stack_fffffffffffffe80.ptr,
                                    (opcodetype *)
                                    CONCAT17(in_stack_fffffffffffffe7f,
                                             CONCAT16(in_stack_fffffffffffffe7e,
                                                      CONCAT15(in_stack_fffffffffffffe7d,
                                                               CONCAT14(in_stack_fffffffffffffe7c,
                                                                        in_stack_fffffffffffffe78)))
                                            ),&in_stack_fffffffffffffe70->vData),
               !(bool)in_stack_fffffffffffffe66)) {
              in_stack_fffffffffffffe9c = 0;
              goto LAB_019127e6;
            }
            sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          } while (sVar4 == 0);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffffe68.ptr,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_fffffffffffffe67,
                              CONCAT16(in_stack_fffffffffffffe66,
                                       CONCAT15(in_stack_fffffffffffffe65,
                                                CONCAT14(in_stack_fffffffffffffe64,
                                                         in_stack_fffffffffffffe60)))),
                     (type)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          vKey_01.m_size._0_4_ = in_stack_fffffffffffffe98;
          vKey_01.m_data = (uchar *)in_RDI;
          vKey_01.m_size._4_4_ = in_stack_fffffffffffffe9c;
          in_stack_fffffffffffffe65 = contains(in_stack_fffffffffffffe70,vKey_01);
        } while (!(bool)in_stack_fffffffffffffe65);
        local_f9 = 1;
        in_stack_fffffffffffffe9c = 1;
LAB_019127e6:
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe68.ptr);
        if (in_stack_fffffffffffffe9c != 0) goto LAB_0191281b;
        __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
        operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      local_f9 = 0;
    }
    else {
      local_f9 = 1;
    }
  }
LAB_0191281b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(local_f9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CBloomFilter::IsRelevantAndUpdate(const CTransaction& tx)
{
    bool fFound = false;
    // Match if the filter contains the hash of tx
    //  for finding tx when they appear in a block
    if (vData.empty()) // zero-size = "match-all" filter
        return true;
    const Txid& hash = tx.GetHash();
    if (contains(hash.ToUint256()))
        fFound = true;

    for (unsigned int i = 0; i < tx.vout.size(); i++)
    {
        const CTxOut& txout = tx.vout[i];
        // Match if the filter contains any arbitrary script data element in any scriptPubKey in tx
        // If this matches, also add the specific output that was matched.
        // This means clients don't have to update the filter themselves when a new relevant tx
        // is discovered in order to find spending transactions, which avoids round-tripping and race conditions.
        CScript::const_iterator pc = txout.scriptPubKey.begin();
        std::vector<unsigned char> data;
        while (pc < txout.scriptPubKey.end())
        {
            opcodetype opcode;
            if (!txout.scriptPubKey.GetOp(pc, opcode, data))
                break;
            if (data.size() != 0 && contains(data))
            {
                fFound = true;
                if ((nFlags & BLOOM_UPDATE_MASK) == BLOOM_UPDATE_ALL)
                    insert(COutPoint(hash, i));
                else if ((nFlags & BLOOM_UPDATE_MASK) == BLOOM_UPDATE_P2PUBKEY_ONLY)
                {
                    std::vector<std::vector<unsigned char> > vSolutions;
                    TxoutType type = Solver(txout.scriptPubKey, vSolutions);
                    if (type == TxoutType::PUBKEY || type == TxoutType::MULTISIG) {
                        insert(COutPoint(hash, i));
                    }
                }
                break;
            }
        }
    }

    if (fFound)
        return true;

    for (const CTxIn& txin : tx.vin)
    {
        // Match if the filter contains an outpoint tx spends
        if (contains(txin.prevout))
            return true;

        // Match if the filter contains any arbitrary script data element in any scriptSig in tx
        CScript::const_iterator pc = txin.scriptSig.begin();
        std::vector<unsigned char> data;
        while (pc < txin.scriptSig.end())
        {
            opcodetype opcode;
            if (!txin.scriptSig.GetOp(pc, opcode, data))
                break;
            if (data.size() != 0 && contains(data))
                return true;
        }
    }

    return false;
}